

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall duckdb::Vector::Reinterpret(Vector *this,Vector *other)

{
  Vector *other_00;
  Vector new_vector;
  undefined1 auStack_a8 [16];
  LogicalType local_98;
  Vector local_80;
  
  this->vector_type = other->vector_type;
  AssignSharedPointer<duckdb::VectorBuffer>(&this->buffer,&other->buffer);
  if (this->vector_type == DICTIONARY_VECTOR) {
    LogicalType::LogicalType(&local_98,&this->type);
    Vector(&local_80,&local_98,(data_ptr_t)0x0);
    LogicalType::~LogicalType(&local_98);
    other_00 = DictionaryVector::Child(other);
    Reinterpret(&local_80,other_00);
    make_shared_ptr<duckdb::VectorChildBuffer,duckdb::Vector>((Vector *)auStack_a8);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorChildBuffer,_0>
              (&this->auxiliary,(shared_ptr<duckdb::VectorChildBuffer,_true> *)auStack_a8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 8));
    ~Vector(&local_80);
  }
  else {
    AssignSharedPointer<duckdb::VectorBuffer>(&this->auxiliary,&other->auxiliary);
  }
  this->data = other->data;
  TemplatedValidityMask<unsigned_long>::operator=
            (&(this->validity).super_TemplatedValidityMask<unsigned_long>,
             &(other->validity).super_TemplatedValidityMask<unsigned_long>);
  return;
}

Assistant:

void Vector::Reinterpret(const Vector &other) {
	vector_type = other.vector_type;
#ifdef DEBUG
	auto &this_type = GetType();
	auto &other_type = other.GetType();

	auto type_is_same = other_type == this_type;
	bool this_is_nested = this_type.IsNested();
	bool other_is_nested = other_type.IsNested();

	bool not_nested = this_is_nested == false && other_is_nested == false;
	bool type_size_equal = GetTypeIdSize(this_type.InternalType()) == GetTypeIdSize(other_type.InternalType());
	//! Either the types are completely identical, or they are not nested and their physical type size is the same
	//! The reason nested types are not allowed is because copying the auxiliary buffer does not happen recursively
	//! e.g DOUBLE[] to BIGINT[], the type of the LIST would say BIGINT but the child Vector says DOUBLE
	D_ASSERT((not_nested && type_size_equal) || type_is_same);
#endif
	AssignSharedPointer(buffer, other.buffer);
	if (vector_type == VectorType::DICTIONARY_VECTOR) {
		Vector new_vector(GetType(), nullptr);
		new_vector.Reinterpret(DictionaryVector::Child(other));
		auxiliary = make_shared_ptr<VectorChildBuffer>(std::move(new_vector));
	} else {
		AssignSharedPointer(auxiliary, other.auxiliary);
	}
	data = other.data;
	validity = other.validity;
}